

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O1

void ihevc_inter_pred_chroma_horz_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM4 [16];
  
  auVar2 = _DAT_00176aa0;
  auVar1 = _DAT_00176a90;
  if (0 < ht) {
    iVar4 = 0;
    do {
      if (0 < wd) {
        lVar3 = 0;
        do {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(pu1_src + lVar3 + -2);
          auVar6 = pshufb(auVar5,auVar1);
          in_XMM4 = pmovsxbd(in_XMM4,*(undefined4 *)pi1_coeff);
          auVar6 = pmaddwd(auVar6,in_XMM4);
          auVar6 = phaddd(auVar6,auVar6);
          auVar5 = pshufb(auVar5,auVar2);
          auVar6 = phaddd(auVar6,auVar6);
          auVar5 = pmaddwd(auVar5,in_XMM4);
          auVar5 = phaddd(auVar5,auVar5);
          auVar5 = phaddd(auVar5,auVar5);
          pi2_dst[lVar3] = auVar5._0_2_;
          pi2_dst[lVar3 + 1] = auVar6._0_2_;
          lVar3 = lVar3 + 2;
        } while (lVar3 < wd * 2);
      }
      pu1_src = pu1_src + src_strd;
      iVar4 = iVar4 + 1;
      pi2_dst = pi2_dst + dst_strd;
    } while (iVar4 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz_w16out(UWORD8 *pu1_src,
                                         WORD16 *pi2_dst,
                                         WORD32 src_strd,
                                         WORD32 dst_strd,
                                         WORD8 *pi1_coeff,
                                         WORD32 ht,
                                         WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp_u, i2_tmp_v;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i2_tmp_u = 0;
            i2_tmp_v = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i2_tmp_u += pi1_coeff[i] * pu1_src[col + (i - 1) * 2];
                i2_tmp_v += pi1_coeff[i] * pu1_src[col + 1 + (i - 1) * 2];
            }

            pi2_dst[col] = i2_tmp_u;
            pi2_dst[col + 1] = i2_tmp_v;
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }
}